

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins_tests.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_499f32::CCoinsViewTest::BatchWrite
          (CCoinsViewTest *this,CoinsViewCacheCursor *cursor,uint256 *hashBlock)

{
  long lVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  bool bVar7;
  int iVar8;
  CoinsCachePair *pCVar9;
  mapped_type *this_00;
  CoinsCachePair *current;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar9 = cursor->m_sentinel;
  current = (pCVar9->second).m_next;
  while (current != pCVar9) {
    if (((current->second).m_flags & 1) != 0) {
      this_00 = std::
                map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                ::operator[](&this->map_,&current->first);
      Coin::operator=(this_00,&(current->second).coin);
      if ((current->second).coin.out.nValue == -1) {
        iVar8 = RandomMixin<FastRandomContext>::randrange<int>
                          (&this->m_rng->super_RandomMixin<FastRandomContext>,3);
        if (iVar8 == 0) {
          std::
          _Rb_tree<COutPoint,_std::pair<const_COutPoint,_Coin>,_std::_Select1st<std::pair<const_COutPoint,_Coin>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
          ::erase(&(this->map_)._M_t,&current->first);
        }
      }
    }
    current = CoinsViewCacheCursor::NextAndMaybeErase(cursor,current);
    pCVar9 = cursor->m_sentinel;
  }
  bVar7 = base_blob<256U>::IsNull(&hashBlock->super_base_blob<256U>);
  if (!bVar7) {
    uVar2 = *(undefined4 *)(hashBlock->super_base_blob<256U>).m_data._M_elems;
    uVar3 = *(undefined4 *)((hashBlock->super_base_blob<256U>).m_data._M_elems + 4);
    uVar4 = *(undefined4 *)((hashBlock->super_base_blob<256U>).m_data._M_elems + 8);
    uVar5 = *(undefined4 *)((hashBlock->super_base_blob<256U>).m_data._M_elems + 0xc);
    uVar6 = *(undefined8 *)((hashBlock->super_base_blob<256U>).m_data._M_elems + 0x18);
    *(undefined8 *)((this->hashBestBlock_).super_base_blob<256U>.m_data._M_elems + 0x10) =
         *(undefined8 *)((hashBlock->super_base_blob<256U>).m_data._M_elems + 0x10);
    *(undefined8 *)((this->hashBestBlock_).super_base_blob<256U>.m_data._M_elems + 0x18) = uVar6;
    *(undefined4 *)(this->hashBestBlock_).super_base_blob<256U>.m_data._M_elems = uVar2;
    *(undefined4 *)((this->hashBestBlock_).super_base_blob<256U>.m_data._M_elems + 4) = uVar3;
    *(undefined4 *)((this->hashBestBlock_).super_base_blob<256U>.m_data._M_elems + 8) = uVar4;
    *(undefined4 *)((this->hashBestBlock_).super_base_blob<256U>.m_data._M_elems + 0xc) = uVar5;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return true;
  }
  __stack_chk_fail();
}

Assistant:

bool BatchWrite(CoinsViewCacheCursor& cursor, const uint256& hashBlock) override
    {
        for (auto it{cursor.Begin()}; it != cursor.End(); it = cursor.NextAndMaybeErase(*it)){
            if (it->second.IsDirty()) {
                // Same optimization used in CCoinsViewDB is to only write dirty entries.
                map_[it->first] = it->second.coin;
                if (it->second.coin.IsSpent() && m_rng.randrange(3) == 0) {
                    // Randomly delete empty entries on write.
                    map_.erase(it->first);
                }
            }
        }
        if (!hashBlock.IsNull())
            hashBestBlock_ = hashBlock;
        return true;
    }